

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*arg) [2],unsigned_long *args,
                   char (*args_1) [2],char *args_2,char (*args_3) [2],unsigned_long *args_4,
                   char (*args_5) [2],char *args_6,char (*args_7) [2])

{
  string local_70;
  string local_50;
  
  StringBuilder_abi_cxx11_(&local_50,*arg);
  StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (&local_70,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}